

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMvMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Geometry *pGVar4;
  RTCIntersectArguments *pRVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [32];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ulong uVar15;
  undefined8 uVar16;
  byte bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  StackItemT<embree::NodeRefPtr<8>_> *pSVar22;
  byte bVar23;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar24) [32];
  long lVar25;
  byte bVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  bool bVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar39 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar70 [16];
  undefined4 uVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  uint uVar74;
  uint uVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  long lStack_2600;
  byte local_25f0;
  int local_25bc;
  ulong local_25b8;
  StackItemT<embree::NodeRefPtr<8>_> *local_25b0;
  RayQueryContext *local_25a8;
  long local_25a0;
  Scene *local_2598;
  long local_2590;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  float local_2528;
  float local_24b8 [4];
  float local_24a8 [4];
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  undefined1 local_2478 [16];
  undefined1 local_2468 [16];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr != 8) {
    local_25b0 = stack + 1;
    stack[0].dist = 0;
    aVar1 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar39 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    fVar62 = (ray->super_RayK<1>).tfar;
    auVar66 = ZEXT464((uint)fVar62);
    auVar35._8_4_ = 0x7fffffff;
    auVar35._0_8_ = 0x7fffffff7fffffff;
    auVar35._12_4_ = 0x7fffffff;
    auVar35 = vandps_avx512vl((undefined1  [16])aVar1,auVar35);
    auVar37._8_4_ = 0x219392ef;
    auVar37._0_8_ = 0x219392ef219392ef;
    auVar37._12_4_ = 0x219392ef;
    uVar30 = vcmpps_avx512vl(auVar35,auVar37,1);
    bVar33 = (bool)((byte)uVar30 & 1);
    auVar36._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * (int)aVar1.x;
    bVar33 = (bool)((byte)(uVar30 >> 1) & 1);
    auVar36._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * (int)aVar1.y;
    bVar33 = (bool)((byte)(uVar30 >> 2) & 1);
    auVar36._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * (int)aVar1.z;
    bVar33 = (bool)((byte)(uVar30 >> 3) & 1);
    auVar36._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * aVar1.field_3.a;
    auVar37 = vrcp14ps_avx512vl(auVar36);
    auVar38._8_4_ = 0x3f800000;
    auVar38._0_8_ = 0x3f8000003f800000;
    auVar38._12_4_ = 0x3f800000;
    auVar38 = vfnmadd213ps_avx512vl(auVar36,auVar37,auVar38);
    auVar35 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar62));
    auVar37 = vfmadd132ps_fma(auVar38,auVar37,auVar37);
    auVar52 = vbroadcastss_avx512vl(auVar37);
    auVar77 = ZEXT3264(auVar52);
    auVar38 = vmovshdup_avx(auVar37);
    auVar52 = vbroadcastsd_avx512vl(auVar38);
    auVar78 = ZEXT3264(auVar52);
    auVar36 = vshufpd_avx(auVar37,auVar37,1);
    auVar56._8_4_ = 2;
    auVar56._0_8_ = 0x200000002;
    auVar56._12_4_ = 2;
    auVar56._16_4_ = 2;
    auVar56._20_4_ = 2;
    auVar56._24_4_ = 2;
    auVar56._28_4_ = 2;
    auVar52 = vpermps_avx512vl(auVar56,ZEXT1632(auVar37));
    auVar79 = ZEXT3264(auVar52);
    fVar62 = auVar37._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar57._4_4_ = fVar62;
    auVar57._0_4_ = fVar62;
    auVar57._8_4_ = fVar62;
    auVar57._12_4_ = fVar62;
    auVar57._16_4_ = fVar62;
    auVar57._20_4_ = fVar62;
    auVar57._24_4_ = fVar62;
    auVar57._28_4_ = fVar62;
    auVar52 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar80 = ZEXT3264(auVar52);
    auVar54 = ZEXT1632(CONCAT412(auVar37._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar37._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar37._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar62))
                                ));
    auVar53 = vpermps_avx512vl(auVar52,auVar54);
    auVar52 = vpermps_avx2(auVar56,auVar54);
    local_25b8 = (ulong)(auVar37._0_4_ < 0.0) << 5;
    uVar30 = (ulong)(auVar38._0_4_ < 0.0) << 5 | 0x40;
    uVar32 = (ulong)(auVar36._0_4_ < 0.0) << 5 | 0x80;
    uVar31 = local_25b8 ^ 0x20;
    auVar54 = vbroadcastss_avx512vl(auVar39);
    auVar81 = ZEXT3264(auVar54);
    auVar55._8_4_ = 0x80000000;
    auVar55._0_8_ = 0x8000000080000000;
    auVar55._12_4_ = 0x80000000;
    auVar55._16_4_ = 0x80000000;
    auVar55._20_4_ = 0x80000000;
    auVar55._24_4_ = 0x80000000;
    auVar55._28_4_ = 0x80000000;
    uVar71 = auVar35._0_4_;
    auVar65 = ZEXT3264(CONCAT428(uVar71,CONCAT424(uVar71,CONCAT420(uVar71,CONCAT416(uVar71,CONCAT412
                                                  (uVar71,CONCAT48(uVar71,CONCAT44(uVar71,uVar71))))
                                                  ))));
    auVar54 = vxorps_avx512vl(auVar57,auVar55);
    auVar82 = ZEXT3264(auVar54);
    auVar53 = vxorps_avx512vl(auVar53,auVar55);
    auVar83 = ZEXT3264(auVar53);
    auVar52 = vxorps_avx512vl(auVar52,auVar55);
    auVar84 = ZEXT3264(auVar52);
    auVar52 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar85 = ZEXT3264(auVar52);
    auVar52 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar86 = ZEXT3264(auVar52);
    auVar39 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
    auVar87 = ZEXT1664(auVar39);
    auVar52 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
    auVar88 = ZEXT3264(auVar52);
    local_25a8 = context;
LAB_01c5f9f4:
    if (local_25b0 != stack) {
      pSVar22 = local_25b0 + -1;
      local_25b0 = local_25b0 + -1;
      if ((float)pSVar22->dist <= auVar66._0_4_) {
        uVar27 = (local_25b0->ptr).ptr;
        do {
          while( true ) {
            lStack_2600 = 0x10;
            uVar71 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
            auVar52._4_4_ = uVar71;
            auVar52._0_4_ = uVar71;
            auVar52._8_4_ = uVar71;
            auVar52._12_4_ = uVar71;
            auVar52._16_4_ = uVar71;
            auVar52._20_4_ = uVar71;
            auVar52._24_4_ = uVar71;
            auVar52._28_4_ = uVar71;
            do {
              if ((uVar27 & 8) != 0) {
                local_2590 = (ulong)((uint)uVar27 & 0xf) - 8;
                uVar27 = uVar27 & 0xfffffffffffffff0;
                local_25a0 = 0;
                goto LAB_01c5fde5;
              }
              pauVar24 = (undefined1 (*) [32])(uVar27 & 0xfffffffffffffff0);
              auVar39 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + local_25b8),auVar52,
                                        *(undefined1 (*) [32])(pauVar24[2] + local_25b8));
              auVar53 = vfmadd213ps_avx512vl(ZEXT1632(auVar39),auVar77._0_32_,auVar82._0_32_);
              auVar54 = vmaxps_avx512vl(auVar81._0_32_,auVar53);
              auVar39 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + uVar30),auVar52,
                                        *(undefined1 (*) [32])(pauVar24[2] + uVar30));
              auVar35 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + uVar32),auVar52,
                                        *(undefined1 (*) [32])(pauVar24[2] + uVar32));
              auVar53 = vfmadd213ps_avx512vl(ZEXT1632(auVar39),auVar78._0_32_,auVar83._0_32_);
              auVar55 = vfmadd213ps_avx512vl(ZEXT1632(auVar35),auVar79._0_32_,auVar84._0_32_);
              auVar53 = vmaxps_avx(auVar53,auVar55);
              auVar53 = vmaxps_avx(auVar54,auVar53);
              auVar39 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + uVar31),auVar52,
                                        *(undefined1 (*) [32])(pauVar24[2] + uVar31));
              auVar54 = vfmadd213ps_avx512vl(ZEXT1632(auVar39),auVar77._0_32_,auVar82._0_32_);
              auVar54 = vminps_avx(auVar65._0_32_,auVar54);
              auVar39 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + (uVar30 ^ 0x20)),
                                        auVar52,*(undefined1 (*) [32])
                                                 (pauVar24[2] + (uVar30 ^ 0x20)));
              auVar35 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + (uVar32 ^ 0x20)),
                                        auVar52,*(undefined1 (*) [32])
                                                 (pauVar24[2] + (uVar32 ^ 0x20)));
              auVar55 = vfmadd213ps_avx512vl(ZEXT1632(auVar39),auVar78._0_32_,auVar83._0_32_);
              auVar56 = vfmadd213ps_avx512vl(ZEXT1632(auVar35),auVar79._0_32_,auVar84._0_32_);
              auVar55 = vminps_avx(auVar55,auVar56);
              auVar54 = vminps_avx(auVar54,auVar55);
              uVar34 = vcmpps_avx512vl(auVar53,auVar54,2);
              if (((uint)uVar27 & 7) == 6) {
                uVar27 = vcmpps_avx512vl(auVar52,pauVar24[0xe],0xd);
                uVar15 = vcmpps_avx512vl(auVar52,pauVar24[0xf],1);
                uVar34 = uVar34 & uVar27 & uVar15;
              }
              bVar23 = (byte)uVar34;
              if (bVar23 == 0) {
                auVar39 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                                 ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0))
                ;
                auVar66 = ZEXT1664(auVar39);
                goto LAB_01c5f9f4;
              }
              auVar54 = *pauVar24;
              auVar55 = pauVar24[1];
              auVar56 = vmovdqa64_avx512vl(auVar85._0_32_);
              auVar56 = vpternlogd_avx512vl(auVar56,auVar53,auVar86._0_32_,0xf8);
              auVar57 = vpcompressd_avx512vl(auVar56);
              auVar59._0_4_ =
                   (uint)(bVar23 & 1) * auVar57._0_4_ | (uint)!(bool)(bVar23 & 1) * auVar56._0_4_;
              bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
              auVar59._4_4_ = (uint)bVar33 * auVar57._4_4_ | (uint)!bVar33 * auVar56._4_4_;
              bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
              auVar59._8_4_ = (uint)bVar33 * auVar57._8_4_ | (uint)!bVar33 * auVar56._8_4_;
              bVar33 = (bool)((byte)(uVar34 >> 3) & 1);
              auVar59._12_4_ = (uint)bVar33 * auVar57._12_4_ | (uint)!bVar33 * auVar56._12_4_;
              bVar33 = (bool)((byte)(uVar34 >> 4) & 1);
              auVar59._16_4_ = (uint)bVar33 * auVar57._16_4_ | (uint)!bVar33 * auVar56._16_4_;
              bVar33 = (bool)((byte)(uVar34 >> 5) & 1);
              auVar59._20_4_ = (uint)bVar33 * auVar57._20_4_ | (uint)!bVar33 * auVar56._20_4_;
              bVar33 = (bool)((byte)(uVar34 >> 6) & 1);
              auVar59._24_4_ = (uint)bVar33 * auVar57._24_4_ | (uint)!bVar33 * auVar56._24_4_;
              bVar33 = SUB81(uVar34 >> 7,0);
              auVar59._28_4_ = (uint)bVar33 * auVar57._28_4_ | (uint)!bVar33 * auVar56._28_4_;
              auVar56 = vpermt2q_avx512vl(auVar54,auVar59,auVar55);
              uVar27 = auVar56._0_8_;
              bVar23 = bVar23 - 1 & bVar23;
            } while (bVar23 == 0);
            auVar52 = vpshufd_avx2(auVar59,0x55);
            vpermt2q_avx512vl(auVar54,auVar52,auVar55);
            auVar56 = vpminsd_avx2(auVar59,auVar52);
            auVar52 = vpmaxsd_avx2(auVar59,auVar52);
            bVar23 = bVar23 - 1 & bVar23;
            if (bVar23 != 0) break;
            auVar56 = vpermi2q_avx512vl(auVar56,auVar54,auVar55);
            uVar27 = auVar56._0_8_;
            auVar54 = vpermt2q_avx512vl(auVar54,auVar52,auVar55);
            (local_25b0->ptr).ptr = auVar54._0_8_;
            lVar25 = 8;
LAB_01c5fba0:
            auVar52 = vpermd_avx2(auVar52,auVar53);
            *(int *)((long)&(local_25b0->ptr).ptr + lVar25) = auVar52._0_4_;
            local_25b0 = (StackItemT<embree::NodeRefPtr<8>_> *)
                         ((long)&(local_25b0->ptr).ptr + lStack_2600);
          }
          auVar11 = vpshufd_avx2(auVar59,0xaa);
          vpermt2q_avx512vl(auVar54,auVar11,auVar55);
          auVar57 = vpminsd_avx2(auVar56,auVar11);
          auVar56 = vpmaxsd_avx2(auVar56,auVar11);
          auVar11 = vpminsd_avx2(auVar52,auVar56);
          auVar56 = vpmaxsd_avx2(auVar52,auVar56);
          bVar23 = bVar23 - 1 & bVar23;
          if (bVar23 == 0) {
            auVar52 = vpermi2q_avx512vl(auVar57,auVar54,auVar55);
            uVar27 = auVar52._0_8_;
            auVar52 = vpermt2q_avx512vl(auVar54,auVar56,auVar55);
            (local_25b0->ptr).ptr = auVar52._0_8_;
            auVar52 = vpermd_avx2(auVar56,auVar53);
            local_25b0->dist = auVar52._0_4_;
            auVar52 = vpermt2q_avx512vl(auVar54,auVar11,auVar55);
            local_25b0[1].ptr.ptr = auVar52._0_8_;
            lVar25 = 0x18;
            lStack_2600 = 0x20;
            auVar52 = auVar11;
            goto LAB_01c5fba0;
          }
          auVar52 = vpshufd_avx2(auVar59,0xff);
          vpermt2q_avx512vl(auVar54,auVar52,auVar55);
          auVar61 = vpminsd_avx2(auVar57,auVar52);
          auVar57 = vpmaxsd_avx2(auVar57,auVar52);
          auVar52 = vpminsd_avx2(auVar11,auVar57);
          auVar57 = vpmaxsd_avx2(auVar11,auVar57);
          auVar11 = vpminsd_avx2(auVar56,auVar57);
          auVar56 = vpmaxsd_avx2(auVar56,auVar57);
          bVar23 = bVar23 - 1 & bVar23;
          if (bVar23 == 0) {
            auVar57 = vpermi2q_avx512vl(auVar61,auVar54,auVar55);
            uVar27 = auVar57._0_8_;
            auVar57 = vpermt2q_avx512vl(auVar54,auVar56,auVar55);
            (local_25b0->ptr).ptr = auVar57._0_8_;
            auVar56 = vpermd_avx2(auVar56,auVar53);
            local_25b0->dist = auVar56._0_4_;
            auVar56 = vpermt2q_avx512vl(auVar54,auVar11,auVar55);
            local_25b0[1].ptr.ptr = auVar56._0_8_;
            auVar56 = vpermd_avx2(auVar11,auVar53);
            local_25b0[1].dist = auVar56._0_4_;
            auVar54 = vpermt2q_avx512vl(auVar54,auVar52,auVar55);
            local_25b0[2].ptr.ptr = auVar54._0_8_;
            lStack_2600 = 0x28;
            lVar25 = lStack_2600;
            lStack_2600 = 0x30;
            goto LAB_01c5fba0;
          }
          auVar58 = valignd_avx512vl(auVar59,auVar59,3);
          auVar59 = vmovdqa64_avx512vl(auVar87._0_32_);
          auVar57 = vmovdqa64_avx512vl(auVar87._0_32_);
          auVar60 = vmovdqa64_avx512vl(auVar88._0_32_);
          auVar61 = vpermt2d_avx512vl(auVar57,auVar88._0_32_,auVar61);
          auVar57 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
          auVar52 = vpermt2d_avx512vl(auVar61,auVar57,auVar52);
          auVar57 = vpermt2d_avx512vl(auVar52,auVar57,auVar11);
          auVar52 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
          auVar52 = vpermt2d_avx512vl(auVar57,auVar52,auVar56);
          auVar66 = ZEXT3264(auVar52);
          bVar26 = bVar23;
          do {
            auVar56 = auVar66._0_32_;
            auVar52 = vpermps_avx512vl(auVar80._0_32_,auVar58);
            auVar58 = valignd_avx512vl(auVar58,auVar58,1);
            vpermt2q_avx512vl(auVar54,auVar58,auVar55);
            bVar26 = bVar26 - 1 & bVar26;
            uVar16 = vpcmpd_avx512vl(auVar52,auVar56,5);
            auVar52 = vpmaxsd_avx2(auVar52,auVar56);
            bVar17 = (byte)uVar16 << 1;
            auVar56 = valignd_avx512vl(auVar56,auVar56,7);
            bVar33 = (bool)((byte)uVar16 & 1);
            bVar6 = (bool)(bVar17 >> 2 & 1);
            bVar7 = (bool)(bVar17 >> 3 & 1);
            bVar8 = (bool)(bVar17 >> 4 & 1);
            bVar9 = (bool)(bVar17 >> 5 & 1);
            bVar10 = (bool)(bVar17 >> 6 & 1);
            auVar66 = ZEXT3264(CONCAT428((uint)(bVar17 >> 7) * auVar56._28_4_ |
                                         (uint)!(bool)(bVar17 >> 7) * auVar52._28_4_,
                                         CONCAT424((uint)bVar10 * auVar56._24_4_ |
                                                   (uint)!bVar10 * auVar52._24_4_,
                                                   CONCAT420((uint)bVar9 * auVar56._20_4_ |
                                                             (uint)!bVar9 * auVar52._20_4_,
                                                             CONCAT416((uint)bVar8 * auVar56._16_4_
                                                                       | (uint)!bVar8 *
                                                                         auVar52._16_4_,
                                                                       CONCAT412((uint)bVar7 *
                                                                                 auVar56._12_4_ |
                                                                                 (uint)!bVar7 *
                                                                                 auVar52._12_4_,
                                                                                 CONCAT48((uint)
                                                  bVar6 * auVar56._8_4_ |
                                                  (uint)!bVar6 * auVar52._8_4_,
                                                  CONCAT44((uint)bVar33 * auVar56._4_4_ |
                                                           (uint)!bVar33 * auVar52._4_4_,
                                                           auVar52._0_4_))))))));
          } while (bVar26 != 0);
          lVar25 = (ulong)(uint)POPCOUNT((uint)bVar23) + 3;
          while( true ) {
            auVar56 = auVar66._0_32_;
            auVar52 = vpermt2q_avx512vl(auVar54,auVar56,auVar55);
            uVar27 = auVar52._0_8_;
            bVar33 = lVar25 == 0;
            lVar25 = lVar25 + -1;
            if (bVar33) break;
            (local_25b0->ptr).ptr = uVar27;
            auVar52 = vpermd_avx2(auVar56,auVar53);
            local_25b0->dist = auVar52._0_4_;
            auVar52 = valignd_avx512vl(auVar56,auVar56,1);
            auVar66 = ZEXT3264(auVar52);
            local_25b0 = local_25b0 + 1;
          }
          auVar52 = vmovdqa64_avx512vl(auVar59);
          auVar87 = ZEXT3264(auVar52);
          auVar52 = vmovdqa64_avx512vl(auVar60);
          auVar88 = ZEXT3264(auVar52);
        } while( true );
      }
      goto LAB_01c5f9f4;
    }
  }
  return;
LAB_01c5fde5:
  if (local_25a0 == local_2590) goto LAB_01c60592;
  lVar25 = local_25a0 * 0x140;
  uVar71 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
  auVar40._4_4_ = uVar71;
  auVar40._0_4_ = uVar71;
  auVar40._8_4_ = uVar71;
  auVar40._12_4_ = uVar71;
  auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0x90 + lVar25),auVar40,
                            *(undefined1 (*) [16])(uVar27 + lVar25));
  auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0xa0 + lVar25),auVar40,
                            *(undefined1 (*) [16])(uVar27 + 0x10 + lVar25));
  auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0xb0 + lVar25),auVar40,
                            *(undefined1 (*) [16])(uVar27 + 0x20 + lVar25));
  auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0xc0 + lVar25),auVar40,
                            *(undefined1 (*) [16])(uVar27 + 0x30 + lVar25));
  auVar35 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0xd0 + lVar25),auVar40,
                            *(undefined1 (*) [16])(uVar27 + 0x40 + lVar25));
  auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0xe0 + lVar25),auVar40,
                            *(undefined1 (*) [16])(uVar27 + 0x50 + lVar25));
  auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0xf0 + lVar25),auVar40,
                            *(undefined1 (*) [16])(uVar27 + 0x60 + lVar25));
  auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0x100 + lVar25),auVar40,
                            *(undefined1 (*) [16])(uVar27 + 0x70 + lVar25));
  auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0x110 + lVar25),auVar40,
                            *(undefined1 (*) [16])(uVar27 + 0x80 + lVar25));
  auVar39 = vsubps_avx(auVar43,auVar39);
  auVar35 = vsubps_avx(auVar44,auVar35);
  auVar38 = vsubps_avx(auVar45,auVar38);
  auVar36 = vsubps_avx(auVar36,auVar43);
  auVar37 = vsubps_avx(auVar37,auVar44);
  auVar49 = vsubps_avx(auVar49,auVar45);
  auVar41._0_4_ = auVar35._0_4_ * auVar49._0_4_;
  auVar41._4_4_ = auVar35._4_4_ * auVar49._4_4_;
  auVar41._8_4_ = auVar35._8_4_ * auVar49._8_4_;
  auVar41._12_4_ = auVar35._12_4_ * auVar49._12_4_;
  local_2488 = vfmsub231ps_fma(auVar41,auVar37,auVar38);
  auVar46._0_4_ = auVar38._0_4_ * auVar36._0_4_;
  auVar46._4_4_ = auVar38._4_4_ * auVar36._4_4_;
  auVar46._8_4_ = auVar38._8_4_ * auVar36._8_4_;
  auVar46._12_4_ = auVar38._12_4_ * auVar36._12_4_;
  local_2478 = vfmsub231ps_fma(auVar46,auVar49,auVar39);
  auVar47._0_4_ = auVar39._0_4_ * auVar37._0_4_;
  auVar47._4_4_ = auVar39._4_4_ * auVar37._4_4_;
  auVar47._8_4_ = auVar39._8_4_ * auVar37._8_4_;
  auVar47._12_4_ = auVar39._12_4_ * auVar37._12_4_;
  uVar71 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  auVar76._4_4_ = uVar71;
  auVar76._0_4_ = uVar71;
  auVar76._8_4_ = uVar71;
  auVar76._12_4_ = uVar71;
  auVar40 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[1]));
  auVar41 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[2]));
  uVar71 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  auVar42._4_4_ = uVar71;
  auVar42._0_4_ = uVar71;
  auVar42._8_4_ = uVar71;
  auVar42._12_4_ = uVar71;
  auVar42 = vsubps_avx512vl(auVar43,auVar42);
  local_2468 = vfmsub231ps_fma(auVar47,auVar36,auVar35);
  uVar71 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  auVar43._4_4_ = uVar71;
  auVar43._0_4_ = uVar71;
  auVar43._8_4_ = uVar71;
  auVar43._12_4_ = uVar71;
  auVar43 = vsubps_avx512vl(auVar44,auVar43);
  uVar71 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  auVar44._4_4_ = uVar71;
  auVar44._0_4_ = uVar71;
  auVar44._8_4_ = uVar71;
  auVar44._12_4_ = uVar71;
  auVar44 = vsubps_avx512vl(auVar45,auVar44);
  auVar45 = vmulps_avx512vl(auVar40,auVar44);
  auVar46 = vfmsub231ps_avx512vl(auVar45,auVar43,auVar41);
  auVar45 = vmulps_avx512vl(auVar41,auVar42);
  auVar47 = vfmsub231ps_avx512vl(auVar45,auVar44,auVar76);
  auVar45 = vmulps_avx512vl(auVar76,auVar43);
  auVar48 = vfmsub231ps_avx512vl(auVar45,auVar42,auVar40);
  auVar45 = vmulps_avx512vl(local_2468,auVar41);
  auVar45 = vfmadd231ps_avx512vl(auVar45,local_2478,auVar40);
  auVar40 = vfmadd231ps_avx512vl(auVar45,local_2488,auVar76);
  auVar45._8_4_ = 0x7fffffff;
  auVar45._0_8_ = 0x7fffffff7fffffff;
  auVar45._12_4_ = 0x7fffffff;
  auVar45 = vandps_avx512vl(auVar40,auVar45);
  auVar49 = vmulps_avx512vl(auVar49,auVar48);
  auVar37 = vfmadd231ps_avx512vl(auVar49,auVar47,auVar37);
  auVar36 = vfmadd231ps_fma(auVar37,auVar46,auVar36);
  auVar49._8_4_ = 0x80000000;
  auVar49._0_8_ = 0x8000000080000000;
  auVar49._12_4_ = 0x80000000;
  auVar37 = vandpd_avx512vl(auVar40,auVar49);
  uVar74 = auVar37._0_4_;
  auVar70._0_4_ = (float)(uVar74 ^ auVar36._0_4_);
  uVar28 = auVar37._4_4_;
  auVar70._4_4_ = (float)(uVar28 ^ auVar36._4_4_);
  uVar75 = auVar37._8_4_;
  auVar70._8_4_ = (float)(uVar75 ^ auVar36._8_4_);
  uVar29 = auVar37._12_4_;
  auVar70._12_4_ = (float)(uVar29 ^ auVar36._12_4_);
  auVar38 = vmulps_avx512vl(auVar38,auVar48);
  auVar35 = vfmadd231ps_avx512vl(auVar38,auVar35,auVar47);
  auVar39 = vfmadd231ps_fma(auVar35,auVar39,auVar46);
  auVar48._0_4_ = (float)(uVar74 ^ auVar39._0_4_);
  auVar48._4_4_ = (float)(uVar28 ^ auVar39._4_4_);
  auVar48._8_4_ = (float)(uVar75 ^ auVar39._8_4_);
  auVar48._12_4_ = (float)(uVar29 ^ auVar39._12_4_);
  auVar39 = ZEXT816(0) << 0x20;
  uVar16 = vcmpps_avx512vl(auVar70,auVar39,5);
  uVar12 = vcmpps_avx512vl(auVar48,auVar39,5);
  uVar13 = vcmpps_avx512vl(auVar40,auVar39,4);
  auVar39._0_4_ = auVar70._0_4_ + auVar48._0_4_;
  auVar39._4_4_ = auVar70._4_4_ + auVar48._4_4_;
  auVar39._8_4_ = auVar70._8_4_ + auVar48._8_4_;
  auVar39._12_4_ = auVar70._12_4_ + auVar48._12_4_;
  uVar14 = vcmpps_avx512vl(auVar39,auVar45,2);
  bVar23 = (byte)uVar16 & (byte)uVar12 & (byte)uVar13 & (byte)uVar14;
  if (bVar23 != 0) {
    auVar73._0_4_ = auVar44._0_4_ * local_2468._0_4_;
    auVar73._4_4_ = auVar44._4_4_ * local_2468._4_4_;
    auVar73._8_4_ = auVar44._8_4_ * local_2468._8_4_;
    auVar73._12_4_ = auVar44._12_4_ * local_2468._12_4_;
    auVar39 = vfmadd213ps_fma(auVar43,local_2478,auVar73);
    auVar39 = vfmadd213ps_fma(auVar42,local_2488,auVar39);
    auVar72._0_4_ = (float)(uVar74 ^ auVar39._0_4_);
    auVar72._4_4_ = (float)(uVar28 ^ auVar39._4_4_);
    auVar72._8_4_ = (float)(uVar75 ^ auVar39._8_4_);
    auVar72._12_4_ = (float)(uVar29 ^ auVar39._12_4_);
    uVar71 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    auVar18._4_4_ = uVar71;
    auVar18._0_4_ = uVar71;
    auVar18._8_4_ = uVar71;
    auVar18._12_4_ = uVar71;
    auVar39 = vmulps_avx512vl(auVar45,auVar18);
    fVar62 = (ray->super_RayK<1>).tfar;
    auVar19._4_4_ = fVar62;
    auVar19._0_4_ = fVar62;
    auVar19._8_4_ = fVar62;
    auVar19._12_4_ = fVar62;
    auVar35 = vmulps_avx512vl(auVar45,auVar19);
    uVar16 = vcmpps_avx512vl(auVar72,auVar35,2);
    uVar12 = vcmpps_avx512vl(auVar39,auVar72,1);
    bVar23 = (byte)uVar16 & (byte)uVar12 & bVar23;
    if (bVar23 != 0) {
      lVar25 = lVar25 + uVar27;
      auVar2._0_4_ = (ray->super_RayK<1>).tfar;
      auVar2._4_4_ = (ray->super_RayK<1>).mask;
      auVar2._8_4_ = (ray->super_RayK<1>).id;
      auVar2._12_4_ = (ray->super_RayK<1>).flags;
      auVar66 = ZEXT1664(auVar2);
      uVar74 = vextractps_avx(auVar2,1);
      auVar39 = vrcp14ps_avx512vl(auVar45);
      auVar20._8_4_ = 0x3f800000;
      auVar20._0_8_ = 0x3f8000003f800000;
      auVar20._12_4_ = 0x3f800000;
      auVar35 = vfnmadd213ps_avx512vl(auVar45,auVar39,auVar20);
      auVar39 = vfmadd132ps_fma(auVar35,auVar39,auVar39);
      fVar62 = auVar39._0_4_;
      local_2498._0_4_ = fVar62 * auVar72._0_4_;
      fVar67 = auVar39._4_4_;
      local_2498._4_4_ = fVar67 * auVar72._4_4_;
      fVar68 = auVar39._8_4_;
      local_2498._8_4_ = fVar68 * auVar72._8_4_;
      fVar69 = auVar39._12_4_;
      local_2498._12_4_ = fVar69 * auVar72._12_4_;
      auVar65 = ZEXT1664(local_2498);
      local_24b8[0] = fVar62 * auVar70._0_4_;
      local_24b8[1] = fVar67 * auVar70._4_4_;
      local_24b8[2] = fVar68 * auVar70._8_4_;
      local_24b8[3] = fVar69 * auVar70._12_4_;
      local_24a8[0] = fVar62 * auVar48._0_4_;
      local_24a8[1] = fVar67 * auVar48._4_4_;
      local_24a8[2] = fVar68 * auVar48._8_4_;
      local_24a8[3] = fVar69 * auVar48._12_4_;
      auVar63._8_4_ = 0x7f800000;
      auVar63._0_8_ = 0x7f8000007f800000;
      auVar63._12_4_ = 0x7f800000;
      auVar39 = vblendmps_avx512vl(auVar63,local_2498);
      auVar50._0_4_ = (uint)(bVar23 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar23 & 1) * 0x7f800000;
      bVar33 = (bool)(bVar23 >> 1 & 1);
      auVar50._4_4_ = (uint)bVar33 * auVar39._4_4_ | (uint)!bVar33 * 0x7f800000;
      bVar33 = (bool)(bVar23 >> 2 & 1);
      auVar50._8_4_ = (uint)bVar33 * auVar39._8_4_ | (uint)!bVar33 * 0x7f800000;
      bVar33 = (bool)(bVar23 >> 3 & 1);
      auVar50._12_4_ = (uint)bVar33 * auVar39._12_4_ | (uint)!bVar33 * 0x7f800000;
      auVar39 = vshufps_avx(auVar50,auVar50,0xb1);
      auVar39 = vminps_avx(auVar39,auVar50);
      auVar35 = vshufpd_avx(auVar39,auVar39,1);
      auVar39 = vminps_avx(auVar35,auVar39);
      uVar16 = vcmpps_avx512vl(auVar50,auVar39,0);
      uVar28 = (uint)bVar23;
      if (((byte)uVar16 & bVar23) != 0) {
        bVar23 = (byte)uVar16 & bVar23;
      }
      uVar75 = 0;
      for (uVar29 = (uint)bVar23; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x80000000) {
        uVar75 = uVar75 + 1;
      }
      local_2598 = local_25a8->scene;
      do {
        auVar39 = auVar65._0_16_;
        uVar29 = uVar75 & 0xff;
        h.geomID = *(uint *)(lVar25 + 0x120 + (ulong)uVar29 * 4);
        pGVar4 = (local_2598->geometries).items[h.geomID].ptr;
        local_25f0 = (byte)uVar28;
        if ((pGVar4->mask & uVar74) == 0) {
          local_25f0 = ~(byte)(1 << (uVar75 & 0x1f)) & local_25f0;
        }
        else {
          pRVar5 = local_25a8->args;
          local_2458 = auVar84._0_32_;
          local_2438 = auVar83._0_32_;
          local_2418 = auVar82._0_32_;
          local_23f8 = auVar81._0_32_;
          local_23d8 = auVar79._0_32_;
          local_23b8 = auVar78._0_32_;
          local_2398 = auVar77._0_32_;
          if (pRVar5->filter == (RTCFilterFunctionN)0x0) {
            args.context = local_25a8->user;
            if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
              uVar34 = (ulong)(uVar29 << 2);
              fVar62 = *(float *)((long)local_24b8 + uVar34);
              fVar67 = *(float *)((long)local_24a8 + uVar34);
              (ray->super_RayK<1>).tfar = *(float *)(local_2498 + uVar34);
              (ray->Ng).field_0.field_0.x = *(float *)(local_2488 + uVar34);
              (ray->Ng).field_0.field_0.y = *(float *)(local_2478 + uVar34);
              (ray->Ng).field_0.field_0.z = *(float *)(local_2468 + uVar34);
              ray->u = fVar62;
              ray->v = fVar67;
              ray->primID = *(uint *)(lVar25 + 0x130 + uVar34);
              ray->geomID = h.geomID;
              ray->instID[0] = (args.context)->instID[0];
              ray->instPrimID[0] = (args.context)->instPrimID[0];
              break;
            }
          }
          else {
            args.context = local_25a8->user;
          }
          uVar34 = (ulong)(uVar29 * 4);
          h.Ng.field_0.field_0.x = *(float *)(local_2488 + uVar34);
          h.Ng.field_0.field_0.y = *(float *)(local_2478 + uVar34);
          h.Ng.field_0.field_0.z = *(float *)(local_2468 + uVar34);
          h.u = *(float *)((long)local_24b8 + uVar34);
          h.v = *(float *)((long)local_24a8 + uVar34);
          h.primID = *(uint *)(lVar25 + 0x130 + uVar34);
          h.instID[0] = (args.context)->instID[0];
          h.instPrimID[0] = (args.context)->instPrimID[0];
          (ray->super_RayK<1>).tfar = *(float *)(local_2498 + uVar34);
          local_25bc = -1;
          args.valid = &local_25bc;
          args.geometryUserPtr = pGVar4->userPtr;
          args.ray = (RTCRayN *)ray;
          args.hit = (RTCHitN *)&h;
          args.N = 1;
          if (((pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
              ((*pGVar4->intersectionFilterN)(&args), *args.valid != 0)) &&
             ((pRVar5->filter == (RTCFilterFunctionN)0x0 ||
              ((((pRVar5->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar4->field_8).field_0x2 & 0x40) == 0)) ||
               ((*pRVar5->filter)(&args), *args.valid != 0)))))) {
            *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
            *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
            *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
            *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
            *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
            *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
            *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
            *(undefined4 *)(args.ray + 0x4c) = *(undefined4 *)(args.hit + 0x1c);
            *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
          }
          else {
            local_2528 = auVar66._0_4_;
            (ray->super_RayK<1>).tfar = local_2528;
          }
          auVar3._0_4_ = (ray->super_RayK<1>).tfar;
          auVar3._4_4_ = (ray->super_RayK<1>).mask;
          auVar3._8_4_ = (ray->super_RayK<1>).id;
          auVar3._12_4_ = (ray->super_RayK<1>).flags;
          auVar66 = ZEXT1664(auVar3);
          auVar65 = ZEXT1664(auVar39);
          fVar62 = (ray->super_RayK<1>).tfar;
          auVar21._4_4_ = fVar62;
          auVar21._0_4_ = fVar62;
          auVar21._8_4_ = fVar62;
          auVar21._12_4_ = fVar62;
          uVar16 = vcmpps_avx512vl(auVar39,auVar21,2);
          local_25f0 = ~(byte)(1 << (uVar75 & 0x1f)) & local_25f0 & (byte)uVar16;
          uVar74 = vextractps_avx(auVar3,1);
          auVar77 = ZEXT3264(local_2398);
          auVar78 = ZEXT3264(local_23b8);
          auVar79 = ZEXT3264(local_23d8);
          auVar52 = vbroadcastss_avx512vl(ZEXT416(1));
          auVar80 = ZEXT3264(auVar52);
          auVar81 = ZEXT3264(local_23f8);
          auVar82 = ZEXT3264(local_2418);
          auVar83 = ZEXT3264(local_2438);
          auVar84 = ZEXT3264(local_2458);
          auVar52 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
          auVar85 = ZEXT3264(auVar52);
          auVar52 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
          auVar86 = ZEXT3264(auVar52);
          auVar39 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
          auVar87 = ZEXT1664(auVar39);
          auVar52 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
          auVar88 = ZEXT3264(auVar52);
        }
        uVar28 = (uint)local_25f0;
        if (local_25f0 == 0) break;
        auVar64._8_4_ = 0x7f800000;
        auVar64._0_8_ = 0x7f8000007f800000;
        auVar64._12_4_ = 0x7f800000;
        auVar39 = vblendmps_avx512vl(auVar64,auVar65._0_16_);
        auVar51._0_4_ =
             (uint)(local_25f0 & 1) * auVar39._0_4_ | (uint)!(bool)(local_25f0 & 1) * 0x7f800000;
        bVar33 = (bool)(local_25f0 >> 1 & 1);
        auVar51._4_4_ = (uint)bVar33 * auVar39._4_4_ | (uint)!bVar33 * 0x7f800000;
        bVar33 = (bool)(local_25f0 >> 2 & 1);
        auVar51._8_4_ = (uint)bVar33 * auVar39._8_4_ | (uint)!bVar33 * 0x7f800000;
        bVar33 = (bool)(local_25f0 >> 3 & 1);
        auVar51._12_4_ = (uint)bVar33 * auVar39._12_4_ | (uint)!bVar33 * 0x7f800000;
        auVar39 = vshufps_avx(auVar51,auVar51,0xb1);
        auVar39 = vminps_avx(auVar39,auVar51);
        auVar35 = vshufpd_avx(auVar39,auVar39,1);
        auVar39 = vminps_avx(auVar35,auVar39);
        uVar16 = vcmpps_avx512vl(auVar51,auVar39,0);
        local_25f0 = (byte)uVar16 & local_25f0;
        uVar29 = uVar28;
        if (local_25f0 != 0) {
          uVar29 = (uint)local_25f0;
        }
        uVar75 = 0;
        for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x80000000) {
          uVar75 = uVar75 + 1;
        }
      } while( true );
    }
  }
  local_25a0 = local_25a0 + 1;
  goto LAB_01c5fde5;
LAB_01c60592:
  fVar62 = (ray->super_RayK<1>).tfar;
  auVar65 = ZEXT3264(CONCAT428(fVar62,CONCAT424(fVar62,CONCAT420(fVar62,CONCAT416(fVar62,CONCAT412(
                                                  fVar62,CONCAT48(fVar62,CONCAT44(fVar62,fVar62)))))
                                               )));
  auVar66 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
  goto LAB_01c5f9f4;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }